

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# djpeg.c
# Opt level: O1

boolean print_text_marker(j_decompress_ptr cinfo)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ushort **ppuVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  bool bVar8;
  
  iVar1 = cinfo->err->trace_level;
  uVar2 = jpeg_getc(cinfo);
  uVar3 = jpeg_getc(cinfo);
  uVar7 = uVar2 * 0x100 | uVar3;
  if (0 < iVar1) {
    if (cinfo->unread_marker == 0xfe) {
      fprintf(_stderr,"Comment, length %ld:\n",(ulong)uVar7 - 2);
    }
    else {
      fprintf(_stderr,"APP%d, length %ld:\n",(ulong)(cinfo->unread_marker - 0xe0));
    }
  }
  if (2 < uVar7) {
    uVar7 = 0;
    lVar5 = (ulong)(uVar3 + uVar2 * 0x100) - 2;
    do {
      uVar2 = jpeg_getc(cinfo);
      if (0 < iVar1) {
        if ((char)uVar2 == '\n') {
          bVar8 = uVar7 != 0xd;
          uVar7 = uVar2;
          if (bVar8) goto LAB_00105d60;
        }
        else if ((uVar2 & 0xff) == 0xd) {
LAB_00105d60:
          fputc(10,_stderr);
          uVar7 = uVar2;
        }
        else if ((uVar2 & 0xff) == 0x5c) {
          print_text_marker_cold_1();
          uVar7 = uVar2;
        }
        else {
          ppuVar4 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar4 + (ulong)uVar2 * 2 + 1) & 0x40) == 0) {
            fprintf(_stderr,"\\%03o",(ulong)uVar2);
            uVar7 = uVar2;
          }
          else {
            putc(uVar2,_stderr);
            uVar7 = uVar2;
          }
        }
      }
      lVar6 = lVar5 + -1;
      bVar8 = 0 < lVar5;
      lVar5 = lVar6;
    } while (lVar6 != 0 && bVar8);
  }
  if (0 < iVar1) {
    fputc(10,_stderr);
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
print_text_marker(j_decompress_ptr cinfo)
{
  boolean traceit = (cinfo->err->trace_level >= 1);
  long length;
  unsigned int ch;
  unsigned int lastch = 0;

  length = jpeg_getc(cinfo) << 8;
  length += jpeg_getc(cinfo);
  length -= 2;                  /* discount the length word itself */

  if (traceit) {
    if (cinfo->unread_marker == JPEG_COM)
      fprintf(stderr, "Comment, length %ld:\n", (long)length);
    else                        /* assume it is an APPn otherwise */
      fprintf(stderr, "APP%d, length %ld:\n",
              cinfo->unread_marker - JPEG_APP0, (long)length);
  }

  while (--length >= 0) {
    ch = jpeg_getc(cinfo);
    if (traceit) {
      /* Emit the character in a readable form.
       * Nonprintables are converted to \nnn form,
       * while \ is converted to \\.
       * Newlines in CR, CR/LF, or LF form will be printed as one newline.
       */
      if (ch == '\r') {
        fprintf(stderr, "\n");
      } else if (ch == '\n') {
        if (lastch != '\r')
          fprintf(stderr, "\n");
      } else if (ch == '\\') {
        fprintf(stderr, "\\\\");
      } else if (isprint(ch)) {
        putc(ch, stderr);
      } else {
        fprintf(stderr, "\\%03o", ch);
      }
      lastch = ch;
    }
  }

  if (traceit)
    fprintf(stderr, "\n");

  return TRUE;
}